

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O3

DownloadPackage * __thiscall
Downloader::CLibParse(DownloadPackage *__return_storage_ptr__,Downloader *this,string *package)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parsed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->libname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->libname).field_2;
  (__return_storage_ptr__->libname)._M_string_length = 0;
  (__return_storage_ptr__->libname).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->version)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->version).field_2;
  (__return_storage_ptr__->version)._M_string_length = 0;
  (__return_storage_ptr__->version).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->options)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->url)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->url).field_2;
  (__return_storage_ptr__->url)._M_string_length = 0;
  (__return_storage_ptr__->url).field_2._M_local_buf[0] = '\0';
  pcVar2 = (package->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + package->_M_string_length);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"+","");
  ispring::String::Tokenizer(&local_78,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (0x20 < (ulong)((long)local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->version);
    if (0x40 < (ulong)((long)local_78.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_78.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      uVar4 = 2;
      lVar3 = 0x40;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&__return_storage_ptr__->options,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((local_78.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3))
        ;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar4 < (ulong)((long)local_78.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_78.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

DownloadPackage CLibParse(std::string package){
        DownloadPackage ret;
        std::vector<std::string> parsed=ispring::String::Tokenizer(package,"+");
        ret.libname=parsed[0];
        if(parsed.size()>1)
            ret.version=parsed[1];
        for(int i=2;i<parsed.size();i++)
            ret.options.insert(parsed[i]);
        return ret;
    }